

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O1

HalfCycles __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::
perform_bus_operation<CPU::MC68000::Microcycle<96u>>
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2> *this,
          Microcycle<96U> *cycle,int param_2)

{
  uint uVar1;
  uint8_t v;
  uint uVar3;
  size_t __nbytes;
  long lVar4;
  void *__buf;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint8_t *puVar8;
  WrappedInt<HalfCycles> duration;
  unique_ptr<Apple::IWM,_JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar9;
  undefined1 local_40;
  uint8_t local_3f;
  EventDelegate local_38;
  ssize_t sVar2;
  
  advance_time(this,(HalfCycles)(cycle->length).super_WrappedInt<HalfCycles>.length_);
  uVar3 = (cycle->super_MicrocycleOperationStorage<96U>).operation;
  if ((uVar3 & 0x60) == 0) {
    return (HalfCycles)0;
  }
  uVar1 = *cycle->address;
  __nbytes = (size_t)uVar1;
  uVar6 = uVar1 & 0xffffff;
  (this->mc68000_).super_ProcessorBase.vpa_ = 0xdfffff < uVar6;
  if ((uVar3 >> 10 & 1) != 0 || (uVar3 & 0x403) == 0) {
    return (HalfCycles)0;
  }
  if (Unassigned < this->memory_map_[uVar6 >> 0x11]) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/Macintosh/Macintosh.cpp"
                  ,0xe4,
                  "HalfCycles Apple::Macintosh::ConcreteMachine<Analyser::Static::Macintosh::Target::Model::Mac512ke>::perform_bus_operation(const Microcycle &, int) [model = Analyser::Static::Macintosh::Target::Model::Mac512ke, Microcycle = CPU::MC68000::Microcycle<>]"
                 );
  }
  __buf = (void *)(ulong)(uVar3 & 1);
  uVar5 = uVar6 ^ uVar3 & 1;
  switch(this->memory_map_[uVar6 >> 0x11]) {
  case RAM:
    if (this->ram_mask_ - 0xd900 < uVar5) {
      update_video(this);
    }
    puVar8 = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = this->ram_mask_;
    lVar4 = (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_ % 0x3f980 +
            (this->video_).frame_position_.super_WrappedInt<HalfCycles>.length_;
    duration.length_ = 0;
    if ((lVar4 % 0x2c0 < 0x200) && ((int)(lVar4 / 0x2c0) < 0x156)) {
      if ((long)this->ram_subcycle_ < 8) {
        duration.length_ = 8 - (long)this->ram_subcycle_;
        advance_time(this,(HalfCycles)duration.length_);
      }
      else {
        duration.length_ = 0;
      }
    }
    goto LAB_002cc8e5;
  case ROM:
    if ((uVar3 & 4) == 0) {
      return (HalfCycles)0;
    }
    uVar7 = this->rom_mask_;
    puVar8 = this->rom_;
    duration.length_ = 0;
LAB_002cc8e5:
    uVar3 = (cycle->super_MicrocycleOperationStorage<96U>).operation;
    if ((~uVar3 & 3) == 0) {
      __assert_fail("(this->operation & (Operation::SelectWord | Operation::SelectByte)) != (Operation::SelectWord | Operation::SelectByte)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/Macintosh/../../../Processors/68000/68000.hpp"
                    ,0x15f,
                    "void CPU::MC68000::Microcycle<>::apply(uint8_t *, OperationT) const [op = 96]")
      ;
    }
    uVar3 = uVar3 & 7;
    if (uVar3 - 1 < 6) {
      uVar5 = uVar7 & uVar5;
      switch(uVar3) {
      case 1:
        puVar8[uVar5] = (cycle->value->field_1).b;
        return (HalfCycles)(WrappedInt<HalfCycles>)duration.length_;
      case 2:
        *(SlicedInt16 *)(puVar8 + uVar5) = *cycle->value;
        return (HalfCycles)(WrappedInt<HalfCycles>)duration.length_;
      default:
        return (HalfCycles)(WrappedInt<HalfCycles>)duration.length_;
      case 5:
        (cycle->value->field_1).b = puVar8[uVar5];
        return (HalfCycles)(WrappedInt<HalfCycles>)duration.length_;
      case 6:
        *cycle->value = *(SlicedInt16 *)(puVar8 + uVar5);
        return (HalfCycles)(WrappedInt<HalfCycles>)duration.length_;
      }
    }
    return (HalfCycles)(WrappedInt<HalfCycles>)duration.length_;
  case VIA:
    if ((uVar1 & 1) != 0) goto switchD_002cc61b_caseD_8;
    if ((uVar3 & 4) == 0) {
      local_40 = *(undefined1 *)((long)&(cycle->value->field_0).w + 1);
      local_3f = (cycle->value->field_1).b;
      MOS::MOS6522::
      MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
      ::write(&this->via_,uVar6 >> 9,(void *)(ulong)(byte)(&stack0xffffffffffffffc0)[(long)__buf],
              (ulong)CONCAT31((int3)(uVar1 >> 8),local_40));
      return (HalfCycles)0;
    }
    sVar2 = MOS::MOS6522::
            MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
            ::read(&this->via_,uVar6 >> 9,__buf,__nbytes);
    v = (uint8_t)sVar2;
    break;
  case IWM:
    if ((uVar1 & 1) != 0) {
      if ((uVar3 & 4) == 0) {
        JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1> *)&stack0xffffffffffffffc0);
        IWM::write((IWM *)local_38._vptr_EventDelegate,uVar6 >> 9,
                   (void *)(ulong)(cycle->value->field_1).b,__nbytes);
        return (HalfCycles)0;
      }
      uVar9 = JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::operator->
                        ((JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1> *)&stack0xffffffffffffffc0);
      sVar2 = IWM::read((IWM *)local_38._vptr_EventDelegate,uVar6 >> 9,
                        uVar9._M_t.
                        super___uniq_ptr_impl<Apple::IWM,_JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_Apple::IWM_*,_JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                        .super__Head_base<0UL,_Apple::IWM_*,_false>._M_head_impl,__nbytes);
      CPU::MC68000::Microcycle<96U>::set_value8_low(cycle,(uint8_t)sVar2);
      return (HalfCycles)0;
    }
  case Unassigned:
switchD_002cc61b_caseD_8:
    if ((uVar3 & 4) == 0) {
      return (HalfCycles)0;
    }
    if ((uVar3 & 2) == 0) {
      (cycle->value->field_1).b = 0xff;
      return (HalfCycles)0;
    }
    *cycle->value = (SlicedInt16)0xffff;
    return (HalfCycles)0;
  case SCCWrite:
    if ((uVar3 & 2) == 0) {
      if ((uVar1 & 1) == 0) {
        if ((uVar3 & 4) == 0) {
          return (HalfCycles)0;
        }
      }
      else {
        if ((uVar3 & 4) == 0) {
          Zilog::SCC::z8530::write
                    (&this->scc_,uVar6 >> 1,(void *)(ulong)(cycle->value->field_1).b,__nbytes);
          return (HalfCycles)0;
        }
        Zilog::SCC::z8530::write(&this->scc_,uVar6 >> 1,(void *)0xff,__nbytes);
      }
      (cycle->value->field_1).b = 0xff;
      return (HalfCycles)0;
    }
LAB_002cc820:
    this->phase_ = this->phase_ + 1;
    return (HalfCycles)0;
  case SCCReadResetPhase:
    if ((uVar3 & 2) != 0) goto LAB_002cc820;
    if ((uVar1 & 1) != 0) {
      Zilog::SCC::z8530::reset(&this->scc_);
      if (((cycle->super_MicrocycleOperationStorage<96U>).operation & 4) == 0) {
        return (HalfCycles)0;
      }
      CPU::MC68000::Microcycle<96U>::set_value16(cycle,0xffff);
      return (HalfCycles)0;
    }
    sVar2 = Zilog::SCC::z8530::read(&this->scc_,uVar6 >> 1,__buf,__nbytes);
    v = (uint8_t)sVar2;
    if (((cycle->super_MicrocycleOperationStorage<96U>).operation & 4) == 0) {
      return (HalfCycles)0;
    }
    break;
  case SCSI:
    uVar6 = uVar6 >> 4;
    if ((uVar1 & 1) != 0) {
      if ((uVar3 & 4) != 0) {
        NCR::NCR5380::NCR5380::write(&this->scsi_,uVar6,(void *)0xff,(ulong)(uVar1 >> 9 & 1));
        return (HalfCycles)0;
      }
      local_40 = *(undefined1 *)((long)&(cycle->value->field_0).w + 1);
      local_3f = (cycle->value->field_1).b;
      NCR::NCR5380::NCR5380::write
                (&this->scsi_,uVar6,(void *)(ulong)(byte)(&stack0xffffffffffffffc0)[(long)__buf],0);
      return (HalfCycles)0;
    }
    if ((uVar3 & 4) == 0) {
      return (HalfCycles)0;
    }
    uVar3 = uVar1 >> 9 & 1;
    sVar2 = NCR::NCR5380::NCR5380::read(&this->scsi_,uVar6,(void *)(ulong)uVar3,(ulong)uVar3);
    v = (uint8_t)sVar2;
    break;
  case PhaseRead:
    if ((uVar3 & 4) == 0) {
      return (HalfCycles)0;
    }
    CPU::MC68000::Microcycle<96U>::set_value8_low(cycle,(byte)this->phase_ & 7);
    return (HalfCycles)0;
  }
  CPU::MC68000::Microcycle<96U>::set_value8_high(cycle,v);
  return (HalfCycles)0;
}

Assistant:

HalfCycles perform_bus_operation(const Microcycle &cycle, int) {
			// Advance time.
			advance_time(cycle.length);

			// A null cycle leaves nothing else to do.
			if(!(cycle.operation & (CPU::MC68000::Operation::NewAddress | CPU::MC68000::Operation::SameAddress))) return HalfCycles(0);

			// Grab the address.
			auto address = cycle.host_endian_byte_address();

			// Everything above E0 0000 is signalled as being on the peripheral bus.
			//
			// This will also act to autovector interrupts, since an interrupt acknowledge
			// cycle posts an address with all the higher-order bits set, and VPA doubles
			// as the input to request an autovector.
			mc68000_.set_is_peripheral_address(address >= 0xe0'0000);

			// All code below deals only with reads and writes — cycles in which a
			// data select is active. So quit now if this is not the active part of
			// a read or write.
			//
			// The 68000 uses 6800-style autovectored interrupts, so the mere act of
			// having set VPA above deals with those given that the generated address
			// for interrupt acknowledge cycles always has all bits set except the
			// lowest explicit address lines.
			if(
				!cycle.data_select_active() ||
				(cycle.operation & CPU::MC68000::Operation::InterruptAcknowledge)
			) return HalfCycles(0);

			// Grab the word-precision address being accessed.
			uint8_t *memory_base = nullptr;
			HalfCycles delay;
			switch(memory_map_[address >> 17]) {
				default: assert(false);

				case BusDevice::Unassigned:
					fill_unmapped(cycle);
				return delay;

				case BusDevice::VIA: {
					if(*cycle.address & 1) {
						fill_unmapped(cycle);
					} else {
						const int register_address = address >> 9;

						// VIA accesses are via address 0xefe1fe + register*512,
						// which at word precision is 0x77f0ff + register*256.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_high(via_.read(register_address));
						} else {
							via_.write(register_address, cycle.value8_high());
						}
					}
				} return delay;

				case BusDevice::PhaseRead: {
					if(cycle.operation & CPU::MC68000::Operation::Read) {
						cycle.set_value8_low(phase_ & 7);
					}
				} return delay;

				case BusDevice::IWM: {
					if(*cycle.address & 1) {
						const int register_address = address >> 9;

						// The IWM; this is a purely polled device, so can be run on demand.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_low(iwm_->read(register_address));
						} else {
							iwm_->write(register_address, cycle.value8_low());
						}
					} else {
						fill_unmapped(cycle);
					}
				} return delay;

				case BusDevice::SCSI: {
					const int register_address = address >> 4;
					const bool dma_acknowledge = address & 0x200;

					// Even accesses = read; odd = write.
					if(*cycle.address & 1) {
						// Odd access => this is a write. Data will be in the upper byte.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							scsi_.write(register_address, 0xff, dma_acknowledge);
						} else {
							scsi_.write(register_address, cycle.value8_high());
						}
					} else {
						// Even access => this is a read.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_high(scsi_.read(register_address, dma_acknowledge));
						}
					}
				} return delay;

				case BusDevice::SCCReadResetPhase: {
					// Any word access here adjusts phase.
					if(cycle.operation & CPU::MC68000::Operation::SelectWord) {
						adjust_phase();
					} else {
						// A0 = 1 => reset; A0 = 0 => read.
						if(*cycle.address & 1) {
							scc_.reset();

							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value16(0xffff);
							}
						} else {
							const auto read = scc_.read(int(address >> 1));
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value8_high(read);
							}
						}
					}
				} return delay;

				case BusDevice::SCCWrite: {
					// Any word access here adjusts phase.
					if(cycle.operation & CPU::MC68000::Operation::SelectWord) {
						adjust_phase();
					} else {
						// This is definitely a byte access; either it's to an odd address, in which
						// case it will reach the SCC, or it isn't, in which case it won't.
						if(*cycle.address & 1) {
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								scc_.write(int(address >> 1), 0xff);
								cycle.value->b = 0xff;
							} else {
								scc_.write(int(address >> 1), cycle.value->b);
							}
						} else {
							fill_unmapped(cycle);
						}
					}
				} return delay;

				case BusDevice::RAM: {
					// This is coupled with the Macintosh implementation of video; the magic
					// constant should probably be factored into the Video class.
					// It embodies knowledge of the fact that video (and audio) will always
					// be fetched from the final $d900 bytes of memory.
					// (And that ram_mask_ = ram size - 1).
					if(address > ram_mask_ - 0xd900)
						update_video();

					memory_base = ram_.data();
					address &= ram_mask_;

					// Apply a delay due to video contention if applicable; scheme applied:
					// only every other access slot is available during the period of video
					// output. I believe this to be correct for the 128k, 512k and Plus.
					// More research to do on other models.
					if(video_is_outputting() && ram_subcycle_ < 8) {
						delay = HalfCycles(8 - ram_subcycle_);
						advance_time(delay);
					}
				} break;

				case BusDevice::ROM: {
					if(!(cycle.operation & CPU::MC68000::Operation::Read)) return delay;
					memory_base = rom_;
					address &= rom_mask_;
				} break;
			}

			// If control has fallen through to here, the access is either a read from ROM, or a read or write to RAM.
			// Potential writes to ROM and all hardware accesses have already been weeded out.
			cycle.apply(&memory_base[address]);

			return delay;
		}